

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

uint * __thiscall
Js::InterpreterStackFrame::WasmAtomicsArrayBoundsCheck<unsigned_int>
          (InterpreterStackFrame *this,byte *buffer,uint64 index,uint32 byteLength)

{
  bool bVar1;
  uint *readBuffer;
  uint32 byteLength_local;
  uint64 index_local;
  byte *buffer_local;
  InterpreterStackFrame *this_local;
  
  bVar1 = ::Math::IsAligned<long>((long)(buffer + index),4);
  if (!bVar1) {
    JavascriptError::ThrowWebAssemblyRuntimeError
              (*(ScriptContext **)(this + 0x78),-0x7ff5e489,(PCWSTR)0x0);
  }
  WasmArrayBoundsCheck<unsigned_int>(this,index,byteLength);
  return (uint *)(buffer + index);
}

Assistant:

MemType* InterpreterStackFrame::WasmAtomicsArrayBoundsCheck(byte* buffer, uint64 index, uint32 byteLength)
    {
        MemType* readBuffer = (MemType*)(buffer + index);
        // Do alignment check to be coherent with the order the jit does the checks
        if (!::Math::IsAligned<intptr_t>((intptr_t)readBuffer, sizeof(MemType)))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_UnalignedAtomicAccess);
        }
        WasmArrayBoundsCheck<MemType>(index, byteLength);
        return readBuffer;
    }